

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::FlushPages(PF_BufferMgr *this,int fd)

{
  int iVar1;
  bool bVar2;
  RC RVar3;
  uint uVar4;
  PF_BufPageDesc *pPVar5;
  ulong uVar6;
  int slot;
  
  RVar3 = 0;
  uVar6 = 0;
  StatisticsMgr::Register(pStatisticsMgr,PF_FLUSHPAGES,STAT_ADDONE,(int *)0x0);
  slot = this->first;
  do {
    if (slot == -1) {
      return RVar3;
    }
    pPVar5 = this->bufTable;
    iVar1 = pPVar5[slot].next;
    bVar2 = true;
    if (pPVar5[slot].fd == fd) {
      pPVar5 = pPVar5 + slot;
      if (pPVar5->pinCount == 0) {
        if (pPVar5->bDirty == 0) {
LAB_00105837:
          uVar4 = PF_HashTable::Delete(&this->hashTable,fd,this->bufTable[slot].pageNum);
          if (uVar4 == 0) {
            Unlink(this,slot);
            this->bufTable[slot].next = this->free;
            this->free = slot;
            uVar6 = uVar6 & 0xffffffff;
            goto LAB_00105806;
          }
        }
        else {
          uVar4 = WritePage(this,fd,pPVar5->pageNum,pPVar5->pData);
          if (uVar4 == 0) {
            this->bufTable[slot].bDirty = 0;
            goto LAB_00105837;
          }
        }
        bVar2 = false;
        uVar6 = (ulong)uVar4;
        iVar1 = slot;
      }
      else {
        RVar3 = 1;
      }
    }
LAB_00105806:
    slot = iVar1;
    if (!bVar2) {
      return (RC)uVar6;
    }
  } while( true );
}

Assistant:

RC PF_BufferMgr::FlushPages(int fd)
{
   RC rc, rcWarn = 0;  // return codes

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Flushing all pages for (%d).\n", fd);
   WriteLog(psMessage);
#endif

#ifdef PF_STATS
   pStatisticsMgr->Register(PF_FLUSHPAGES, STAT_ADDONE);
#endif

   // Do a linear scan of the buffer to find pages belonging to the file
   int slot = first;
   while (slot != INVALID_SLOT) {

      int next = bufTable[slot].next;

      // If the page belongs to the passed-in file descriptor
      if (bufTable[slot].fd == fd) {

#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is in buffer manager.\n", bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
         // Ensure the page is not pinned
         if (bufTable[slot].pinCount) {
            rcWarn = PF_PAGEPINNED;
         }
         else {
            // Write the page if dirty
            if (bufTable[slot].bDirty) {
#ifdef PF_LOG
 sprintf (psMessage, "Page (%d) is dirty\n",bufTable[slot].pageNum);
 WriteLog(psMessage);
#endif
               if ((rc = WritePage(fd, bufTable[slot].pageNum, bufTable[slot].pData)))
                  return (rc);
               bufTable[slot].bDirty = FALSE;
            }

            // Remove page from the hash table and add the slot to the free list
            if ((rc = hashTable.Delete(fd, bufTable[slot].pageNum)) ||
                  (rc = Unlink(slot)) ||
                  (rc = InsertFree(slot)))
               return (rc);
         }
      }
      slot = next;
   }

#ifdef PF_LOG
   WriteLog("All necessary pages flushed.\n");
#endif

   // Return warning or ok
   return (rcWarn);
}